

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O1

bool __thiscall glslang::TType::coopMatParameterOK(TType *this,TType *right)

{
  int iVar1;
  int iVar2;
  
  if ((*(uint *)&this->field_0x8 >> 0x15 & 1) == 0) {
    if (((*(uint *)&this->field_0x8 >> 0x16 & 1) != 0) && ((right->field_0xa & 0x40) != 0)) {
      iVar1 = (*this->_vptr_TType[7])(this);
      iVar2 = (*right->_vptr_TType[7])(right);
      if ((iVar1 == iVar2) ||
         ((iVar1 = (*this->_vptr_TType[7])(this), iVar1 == 0x15 ||
          (iVar1 = (*right->_vptr_TType[7])(right), iVar1 == 0x15)))) {
        if (right->typeParameters != (TTypeParameters *)0x0 &&
            this->typeParameters == (TTypeParameters *)0x0) {
          return true;
        }
        return this->typeParameters != (TTypeParameters *)0x0 &&
               right->typeParameters == (TTypeParameters *)0x0;
      }
    }
  }
  else if ((right->field_0xa & 0x20) != 0) {
    iVar1 = (*this->_vptr_TType[7])(this);
    iVar2 = (*right->_vptr_TType[7])(right);
    if (iVar1 != iVar2) {
      return false;
    }
    if (this->typeParameters != (TTypeParameters *)0x0) {
      return false;
    }
    return right->typeParameters != (TTypeParameters *)0x0;
  }
  return false;
}

Assistant:

bool coopMatParameterOK(const TType& right) const
    {
        if (isCoopMatNV()) {
            return right.isCoopMatNV() && (getBasicType() == right.getBasicType()) && typeParameters == nullptr &&
                   right.typeParameters != nullptr;
        }
        if (isCoopMatKHR() && right.isCoopMatKHR()) {
            return ((getBasicType() == right.getBasicType()) || (getBasicType() == EbtCoopmat) ||
                    (right.getBasicType() == EbtCoopmat)) &&
                   ((typeParameters == nullptr && right.typeParameters != nullptr) ||
                    (typeParameters != nullptr && right.typeParameters == nullptr));
        }
        return false;
    }